

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_componentEqualDifferentOrderResets_Test::~Equality_componentEqualDifferentOrderResets_Test
          (Equality_componentEqualDifferentOrderResets_Test *this)

{
  Equality_componentEqualDifferentOrderResets_Test *this_local;
  
  ~Equality_componentEqualDifferentOrderResets_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, componentEqualDifferentOrderResets)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::ResetPtr r1 = libcellml::Reset::create();
    libcellml::ResetPtr r2 = libcellml::Reset::create();
    libcellml::ResetPtr r3 = libcellml::Reset::create();
    libcellml::ResetPtr r4 = libcellml::Reset::create();
    libcellml::ResetPtr r5 = libcellml::Reset::create();
    libcellml::ResetPtr r6 = libcellml::Reset::create();

    r1->setOrder(5);
    r2->setOrder(3);
    r3->setOrder(7);
    r4->setOrder(5);
    r5->setOrder(3);
    r6->setOrder(7);

    c1->addReset(r1);
    c1->addReset(r2);
    c1->addReset(r3);

    c2->addReset(r4);
    c2->addReset(r6);
    c2->addReset(r5);

    EXPECT_TRUE(c1->equals(c2));
    EXPECT_TRUE(c2->equals(c1));
}